

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O0

void __thiscall Httpdata::Add_New_Connect(Httpdata *this,int fd)

{
  Epoll *this_00;
  Httpdata *this_01;
  shared_ptr<channel> local_48 [2];
  undefined1 local_28 [8];
  SP_channel conn_socket;
  int fd_local;
  Httpdata *this_local;
  
  conn_socket.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = fd;
  this_01 = (Httpdata *)operator_new(0x90);
  Httpdata(this_01,conn_socket.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_,0x80000001,readn,writen,(this->super_channel).time_round);
  std::shared_ptr<channel>::shared_ptr<Httpdata,void>((shared_ptr<channel> *)local_28,this_01);
  this_00 = (this->super_channel).attach_epoll;
  std::shared_ptr<channel>::shared_ptr(local_48,(shared_ptr<channel> *)local_28);
  Epoll::Epoll_Add(this_00,local_48,false);
  std::shared_ptr<channel>::~shared_ptr(local_48);
  std::shared_ptr<channel>::~shared_ptr((shared_ptr<channel> *)local_28);
  return;
}

Assistant:

void Httpdata::Add_New_Connect(int fd)
{
    //channel* conn_socket = new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,true);
    SP_channel conn_socket(new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,time_round));
    attach_epoll->Epoll_Add(conn_socket,false);
}